

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O1

void TestSplitOnBorder(void)

{
  _Map_pointer ppCVar1;
  size_type sVar2;
  size_t bytes;
  long *plVar3;
  begin local_2e0;
  OutputBuffer *local_2c8;
  undefined1 local_2c0 [8];
  OutputBuffer newBuf;
  OutputBuffer buf;
  undefined1 local_298 [8];
  lazy_ostream local_290;
  shared_count local_280;
  _Elt_pointer local_278;
  _Map_pointer local_270;
  size_t firstChunkSize;
  assertion_result local_260;
  size_t in;
  string part2;
  string part1;
  undefined1 local_200 [8];
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [16];
  assertion_result local_1e0;
  _Elt_pointer local_1c8;
  istream is;
  
  local_2e0.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_2e0.m_file_name.m_end = "";
  local_2e0.m_line_num = 0x308;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  local_290._vptr_lazy_ostream = (_func_int **)CONCAT71(local_290._vptr_lazy_ostream._1_7_,1);
  is.super_istream._M_gcount = is.super_istream._M_gcount & 0xffffffffffffff00;
  is.super_istream._vptr_basic_istream = (_func_int **)&PTR__lazy_ostream_001ddb78;
  is.super_istream._16_8_ = &boost::unit_test::lazy_ostream::inst;
  is.super_istream._24_8_ = anon_var_dwarf_a4cca;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(lazy_ostream *)&is);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)(local_298 + 8));
  part1._M_dataplus._M_p = (pointer)&part1.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&part1,"This message","");
  part2._M_dataplus._M_p = (pointer)&part2.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&part2," is to be split","");
  avro::OutputBuffer::OutputBuffer(&buf,0);
  avro::detail::BufferImpl::writeTo(buf.pimpl_.px,part1._M_dataplus._M_p,part1._M_string_length);
  firstChunkSize = (buf.pimpl_.px)->size_;
  avro::OutputBuffer::OutputBuffer((OutputBuffer *)&is,0);
  avro::detail::BufferImpl::writeTo
            ((BufferImpl *)is.super_istream._vptr_basic_istream,part2._M_dataplus._M_p,
             part2._M_string_length);
  if (is.super_istream._vptr_basic_istream[0x15] != (_func_int *)0x0) {
    avro::detail::BufferImpl::append
              (buf.pimpl_.px,(BufferImpl *)is.super_istream._vptr_basic_istream);
  }
  avro::InputBuffer::InputBuffer((InputBuffer *)&local_2e0,&buf);
  printBuffer((InputBuffer *)&local_2e0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_2e0.m_file_name.m_end);
  boost::detail::shared_count::~shared_count((shared_count *)&is.super_istream._M_gcount);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x319;
  local_290.m_empty = false;
  local_290._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((buf.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  local_2c0._0_4_ =
       (int)((ulong)((long)((buf.pimpl_.px)->readChunks_).
                           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)((buf.pimpl_.px)->readChunks_).
                          super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
       (int)((ulong)((long)((buf.pimpl_.px)->readChunks_).
                           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)((buf.pimpl_.px)->readChunks_).
                          super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249 +
       ((int)((ulong)((long)ppCVar1 -
                     (long)((buf.pimpl_.px)->readChunks_).
                           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
       (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_1f0._0_8_ = local_2c0;
  newBuf.pimpl_.px = (element_type *)local_298;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_2c0._0_4_ == 2);
  local_298._0_4_ = 2;
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_260.m_message.px = (element_type *)0x1b417e;
  is.super_istream._24_8_ = local_1f0;
  is.super_istream._M_gcount = is.super_istream._M_gcount & 0xffffffffffffff00;
  is.super_istream._vptr_basic_istream = (_func_int **)&PTR__lazy_ostream_001dd878;
  is.super_istream._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_2e0.m_file_name.m_end = (iterator)((ulong)local_2e0.m_file_name.m_end & 0xffffffffffffff00);
  local_2e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd878;
  local_2e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_2c8 = &newBuf;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,(lazy_ostream *)(local_298 + 8),(const_string *)&local_260,0x319,CHECK,
             CHECK_EQUAL,2,"buf.numDataChunks()",&is,"2",&local_2e0);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  sVar2 = (buf.pimpl_.px)->size_;
  local_270 = (_Map_pointer)operator_new__(firstChunkSize);
  avro::istream::istream(&is,&buf);
  in = std::istream::readsome((char *)&is,(long)local_270);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 799;
  local_1e0.m_message.px = (element_type *)((ulong)local_1e0.m_message.px & 0xffffffffffffff00);
  local_1e0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1c8 = (_Elt_pointer)0x1b389c;
  newBuf.pimpl_.px = (element_type *)&in;
  local_2c0 = (undefined1  [8])&firstChunkSize;
  local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(in == firstChunkSize);
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1f0._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + 0x6d;
  local_2e0.m_file_name.m_end = (iterator)((ulong)local_2e0.m_file_name.m_end & 0xffffffffffffff00);
  local_2e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_2e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_290.m_empty = false;
  local_290._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = (_Elt_pointer)local_2c0;
  local_2c8 = &newBuf;
  boost::test_tools::tt_detail::report_assertion
            (&local_260,(lazy_ostream *)&local_1e0,(const_string *)local_1f0,799,CHECK,CHECK_EQUAL,2
             ,"in",&local_2e0,"firstChunkSize",local_298 + 8);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  avro::OutputBuffer::OutputBuffer(&newBuf,0);
  if (*(long *)(is.super_istream._80_8_ + 0xa8) != 0) {
    avro::detail::BufferImpl::append(newBuf.pimpl_.px,(BufferImpl *)is.super_istream._80_8_);
  }
  bytes = std::istream::tellg();
  avro::OutputBuffer::discardData(&newBuf,bytes);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x324;
  local_1e0.m_message.px = (element_type *)((ulong)local_1e0.m_message.px & 0xffffffffffffff00);
  local_1e0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1c8 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((newBuf.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  local_1f8._0_4_ =
       (int)((ulong)((long)((newBuf.pimpl_.px)->readChunks_).
                           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)((newBuf.pimpl_.px)->readChunks_).
                          super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
       (int)((ulong)((long)((newBuf.pimpl_.px)->readChunks_).
                           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)((newBuf.pimpl_.px)->readChunks_).
                          super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249 +
       ((int)((ulong)((long)ppCVar1 -
                     (long)((newBuf.pimpl_.px)->readChunks_).
                           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
       (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_200._0_4_ = 1;
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1f0._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + 0x6d;
  local_2e0.m_file_name.m_end = (iterator)((ulong)local_2e0.m_file_name.m_end & 0xffffffffffffff00);
  local_2e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd878;
  local_2e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_2c8 = (OutputBuffer *)local_2c0;
  local_290.m_empty = false;
  local_290._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd878;
  local_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = (_Elt_pointer)local_298;
  local_2c0 = (undefined1  [8])local_1f8;
  local_298 = (undefined1  [8])local_200;
  local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_1f8._0_4_ == 1);
  boost::test_tools::tt_detail::report_assertion
            (&local_260,(lazy_ostream *)&local_1e0,(const_string *)local_1f0,0x324,CHECK,CHECK_EQUAL
             ,2,"newBuf.numDataChunks()",&local_2e0,"1",local_298 + 8);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x326;
  local_1e0.m_message.px = (element_type *)((ulong)local_1e0.m_message.px & 0xffffffffffffff00);
  local_1e0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1c8 = (_Elt_pointer)0x1b389c;
  local_1f8 = (undefined1  [8])(newBuf.pimpl_.px)->size_;
  local_200 = (undefined1  [8])(sVar2 - in);
  local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_1f8 == local_200);
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1f0._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + 0x6d;
  local_2e0.m_file_name.m_end = (iterator)((ulong)local_2e0.m_file_name.m_end & 0xffffffffffffff00);
  local_2e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_2e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_2c8 = (OutputBuffer *)local_2c0;
  local_290.m_empty = false;
  local_290._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = (_Elt_pointer)local_298;
  local_2c0 = (undefined1  [8])local_1f8;
  local_298 = (undefined1  [8])local_200;
  boost::test_tools::tt_detail::report_assertion
            (&local_260,(lazy_ostream *)&local_1e0,(const_string *)local_1f0,0x326,CHECK,CHECK_EQUAL
             ,2,"newBuf.size()",&local_2e0,"bufsize - in",local_298 + 8);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  plVar3 = (long *)std::ostream::operator<<
                             (&std::cout,
                              *(streambuf **)
                               (&is.super_istream.field_0xe8 +
                               (long)is.super_istream._vptr_basic_istream[-3]));
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  avro::InputBuffer::InputBuffer((InputBuffer *)&local_2e0,&newBuf);
  printBuffer((InputBuffer *)&local_2e0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_2e0.m_file_name.m_end);
  boost::detail::shared_count::~shared_count(&newBuf.pimpl_.pn);
  is.super_istream._vptr_basic_istream = (_func_int **)(avro::istream::vtable + 0x18);
  is.super_istream._136_8_ = 0x1dc698;
  is.super_istream._16_8_ = &PTR__istreambuf_001dc720;
  boost::detail::shared_count::~shared_count((shared_count *)&is.super_istream.field_0x58);
  is.super_istream._16_8_ = sysconf;
  std::locale::~locale((locale *)&is.super_istream.field_0x48);
  is.super_istream._vptr_basic_istream =
       (_func_int **)(std::istream-in-avro::istream::construction_vtable + 0x18);
  is.super_istream._136_8_ = 0x1dc6e8;
  is.super_istream._M_gcount = 0;
  std::ios_base::~ios_base((ios_base *)&is.super_istream.field_0x88);
  operator_delete__(local_270);
  boost::detail::shared_count::~shared_count(&buf.pimpl_.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)part2._M_dataplus._M_p != &part2.field_2) {
    operator_delete(part2._M_dataplus._M_p,part2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)part1._M_dataplus._M_p != &part1.field_2) {
    operator_delete(part1._M_dataplus._M_p,part1.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TestSplitOnBorder()
{
    BOOST_TEST_MESSAGE( "TestSplitOnBorder");
    {

        const std::string part1 = "This message";
        const std::string part2 = " is to be split";

        avro::OutputBuffer buf;
        buf.writeTo(part1.c_str(), part1.size()); 
        size_t firstChunkSize = buf.size();

        {
            avro::OutputBuffer tmp;
            tmp.writeTo(part2.c_str(), part2.size()); 
            buf.append(tmp);
            printBuffer(InputBuffer(buf));
        }

        BOOST_CHECK_EQUAL(buf.numDataChunks(), 2);
        size_t bufsize = buf.size();
    
        boost::scoped_array<char> datain(new char[firstChunkSize]);
        avro::istream is(buf);
        size_t in = static_cast<size_t>(is.readsome(&datain[0], firstChunkSize));
        BOOST_CHECK_EQUAL(in, firstChunkSize);

        OutputBuffer newBuf;
        newBuf.append(is.getBuffer());
        newBuf.discardData(static_cast<size_t>(is.tellg()));
        BOOST_CHECK_EQUAL(newBuf.numDataChunks(), 1);

        BOOST_CHECK_EQUAL(newBuf.size(), bufsize - in);

        cout << is.rdbuf() << endl;
        printBuffer(newBuf);
    }
}